

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::maskValues(MutableCodePointTrie *this,uint32_t mask)

{
  uint32_t *puVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  this->initialValue = this->initialValue & mask;
  this->errorValue = this->errorValue & mask;
  this->highValue = this->highValue & mask;
  uVar2 = this->highStart >> 4;
  if (0 < (int)uVar2) {
    puVar1 = this->index;
    uVar4 = 0;
    do {
      if (this->flags[uVar4] == '\0') {
        puVar1[uVar4] = puVar1[uVar4] & mask;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  if (0 < this->dataLength) {
    puVar1 = this->data;
    lVar3 = 0;
    do {
      puVar1[lVar3] = puVar1[lVar3] & mask;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->dataLength);
  }
  return;
}

Assistant:

void MutableCodePointTrie::maskValues(uint32_t mask) {
    initialValue &= mask;
    errorValue &= mask;
    highValue &= mask;
    int32_t iLimit = highStart >> UCPTRIE_SHIFT_3;
    for (int32_t i = 0; i < iLimit; ++i) {
        if (flags[i] == ALL_SAME) {
            index[i] &= mask;
        }
    }
    for (int32_t i = 0; i < dataLength; ++i) {
        data[i] &= mask;
    }
}